

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitread.c
# Opt level: O3

RK_U32 mpp_has_more_rbsp_data(BitReadCtx_t *bitctx)

{
  MPP_RET MVar1;
  RK_U32 RVar2;
  RK_U32 RVar3;
  uint uVar4;
  ulong uVar5;
  
  RVar3 = bitctx->bytes_left_;
  RVar2 = 0;
  if ((RVar3 != 0) && (RVar2 = RVar3, bitctx->data_[RVar3 - 1] == '\0')) {
    uVar4 = RVar3 - 2;
    do {
      RVar3 = RVar3 - 1;
      bitctx->bytes_left_ = RVar3;
      RVar2 = 0;
      if (RVar3 == 0) break;
      uVar5 = (ulong)uVar4;
      uVar4 = uVar4 - 1;
      RVar2 = RVar3;
    } while (bitctx->data_[uVar5] == '\0');
  }
  if (bitctx->num_remaining_bits_in_curr_byte_ == 0) {
    MVar1 = (*bitctx->update_curbyte)(bitctx);
    if (MVar1 != MPP_OK) {
      return 0;
    }
    RVar2 = bitctx->bytes_left_;
  }
  if (RVar2 == 0) {
    if (bitctx->num_remaining_bits_in_curr_byte_ == 0) {
      return 0;
    }
    return (uint)(((uint)bitctx->curr_byte_ &
                  ~(-1 << ((char)bitctx->num_remaining_bits_in_curr_byte_ - 1U & 0x1f))) != 0);
  }
  return 1;
}

Assistant:

RK_U32 mpp_has_more_rbsp_data(BitReadCtx_t *bitctx)
{
    // remove tail byte which equal zero
    while (bitctx->bytes_left_ &&
           bitctx->data_[bitctx->bytes_left_ - 1] == 0)
        bitctx->bytes_left_--;

    // Make sure we have more bits, if we are at 0 bits in current byte
    // and updating current byte fails, we don't have more data anyway.
    if (bitctx->num_remaining_bits_in_curr_byte_ == 0 && bitctx->update_curbyte(bitctx))
        return 0;
    // On last byte?
    if (bitctx->bytes_left_)
        return 1;
    // Last byte, look for stop bit;
    // We have more RBSP data if the last non-zero bit we find is not the
    // first available bit.
    if (bitctx->num_remaining_bits_in_curr_byte_)
        return (bitctx->curr_byte_ &
                ((1 << (bitctx->num_remaining_bits_in_curr_byte_ - 1)) - 1)) != 0;
    else
        return 0;
}